

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_visitor.hpp
# Opt level: O3

bool __thiscall
jsoncons::basic_json_visitor<char>::key
          (basic_json_visitor<char> *this,string_view_type *name,ser_context *context)

{
  uint uVar1;
  error_category *peVar2;
  int iVar3;
  int iVar4;
  ser_error *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  error_code ec_00;
  error_code ec;
  uint local_38 [2];
  error_category *local_30;
  
  local_38[0] = 0;
  local_30 = (error_category *)std::_V2::system_category();
  (*this->_vptr_basic_json_visitor[9])(this,name,context,local_38);
  if (local_38[0] == 0) {
    return true;
  }
  this_00 = (ser_error *)__cxa_allocate_exception(0x58);
  peVar2 = local_30;
  uVar1 = local_38[0];
  iVar3 = (*context->_vptr_ser_context[2])(context);
  iVar4 = (*context->_vptr_ser_context[3])(context);
  ec_00._4_4_ = 0;
  ec_00._M_value = uVar1;
  ec_00._M_cat = peVar2;
  ser_error::ser_error(this_00,ec_00,CONCAT44(extraout_var,iVar3),CONCAT44(extraout_var_00,iVar4));
  __cxa_throw(this_00,&ser_error::typeinfo,ser_error::~ser_error);
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE key(const string_view_type& name, const ser_context& context=ser_context())
        {
            std::error_code ec;
            visit_key(name, context, ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                JSONCONS_THROW(ser_error(ec, context.line(), context.column()));
            }
            JSONCONS_VISITOR_RETURN;
        }